

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.cpp
# Opt level: O3

maybe<pstore::command_line::option_*,_void> *
pstore::command_line::details::lookup_nearest_option
          (maybe<pstore::command_line::option_*,_void> *__return_storage_ptr__,string *arg,
          options_container *all_options)

{
  type tVar1;
  string *from;
  size_type sVar2;
  type *ptVar3;
  _List_node_base *p_Var4;
  ulong uVar5;
  
  *(undefined8 *)__return_storage_ptr__ = 0;
  __return_storage_ptr__->storage_ = (type)0x0;
  if ((arg->_M_string_length != 0) &&
     (p_Var4 = (all_options->
               super__List_base<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>
               )._M_impl._M_node.super__List_node_base._M_next,
     p_Var4 != (_List_node_base *)all_options)) {
    uVar5 = 0xffffffffffffffff;
    do {
      from = option::name_abi_cxx11_((option *)p_Var4[1]._M_next);
      sVar2 = string_distance(from,arg,uVar5);
      if (sVar2 < uVar5) {
        tVar1 = (type)p_Var4[1]._M_next;
        uVar5 = sVar2;
        if (__return_storage_ptr__->valid_ == true) {
          ptVar3 = (type *)maybe<pstore::command_line::option*,void>::
                           value_impl<pstore::maybe<pstore::command_line::option*,void>&,pstore::command_line::option*>
                                     (__return_storage_ptr__);
          *ptVar3 = tVar1;
        }
        else {
          __return_storage_ptr__->storage_ = tVar1;
          __return_storage_ptr__->valid_ = true;
        }
      }
      p_Var4 = (((_List_base<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>
                  *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var4 != (_List_node_base *)all_options);
  }
  return __return_storage_ptr__;
}

Assistant:

maybe<option *>
                lookup_nearest_option (std::string const & arg,
                                       option::options_container const & all_options) {
                    auto best_option = nothing<option *> ();
                    if (arg.empty ()) {
                        return best_option;
                    }
                    // Find the closest match.
                    auto best_distance = std::numeric_limits<std::string::size_type>::max ();
                    for (auto const & opt : all_options) {
                        auto const distance = string_distance (opt->name (), arg, best_distance);
                        if (distance < best_distance) {
                            best_option = opt;
                            best_distance = distance;
                        }
                    }
                    return best_option;
                }